

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_scene.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_2177e7::PrecacheProgress::Update(PrecacheProgress *this)

{
  DFrameBuffer *pDVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  EColorRange EVar6;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_34;
  int local_30;
  int local_2c;
  int y;
  int x;
  FFont *font;
  char *loadingMessage;
  PrecacheProgress *pPStack_10;
  uint now;
  PrecacheProgress *this_local;
  
  pPStack_10 = this;
  loadingMessage._4_4_ = I_FPSTime();
  if (0xf9 < loadingMessage._4_4_ - this->m_time) {
    font = (FFont *)FStringTable::operator()(&GStrings,"TXT_PRECACHE_WAIT");
    _y = BigFont;
    iVar2 = DCanvas::GetWidth((DCanvas *)screen);
    iVar3 = FFont::StringWidth(_y,(char *)font);
    local_2c = (iVar2 - iVar3 * CleanXfac) / 2;
    iVar2 = DCanvas::GetHeight((DCanvas *)screen);
    iVar3 = FFont::GetHeight(_y);
    local_30 = (iVar2 - iVar3) / 2;
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[8])
              (screen,0,(long)(iVar2 - iVar3) % 2 & 0xffffffff);
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x25])();
    pDVar1 = screen;
    if ((this->m_dimmed & 1U) == 0) {
      PalEntry::PalEntry((PalEntry *)&local_34.field_0,0);
      uVar4 = DCanvas::GetWidth((DCanvas *)screen);
      uVar5 = DCanvas::GetHeight((DCanvas *)screen);
      (*(pDVar1->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
                (0x3f6e147b,pDVar1,(ulong)local_34.d,0,0,(ulong)uVar4,(ulong)uVar5);
      this->m_dimmed = true;
    }
    DCanvas::DrawText((DCanvas *)screen,BigFont,this->m_color,local_2c,local_30,(char *)font,
                      0x40001393,1,0);
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x19])();
    this->m_time = loadingMessage._4_4_;
    EVar6 = CR_YELLOW;
    if (this->m_color == CR_YELLOW) {
      EVar6 = CR_GOLD;
    }
    this->m_color = EVar6;
  }
  return;
}

Assistant:

void Update()
	{
		static const unsigned int UPDATE_TIME_MS = 250;
		const unsigned int now = I_FPSTime();

		if (UPDATE_TIME_MS > now - m_time)
		{
			return;
		}

		const char* const loadingMessage = GStrings("TXT_PRECACHE_WAIT");
		FFont* const font = BigFont;

		const int x = (SCREENWIDTH  - font->StringWidth(loadingMessage) * CleanXfac) / 2;
		const int y = (SCREENHEIGHT - font->GetHeight()) / 2;

		screen->Lock(false);
		screen->Begin2D(false);

		if (!m_dimmed)
		{
			// Dim amount is a guess value
			// [?] should depend on gamma/brightness/contrast [?]
			screen->Dim(0, 0.93f, 0, 0, SCREENWIDTH, SCREENHEIGHT);
			m_dimmed = true;
		}

		screen->DrawText(BigFont, m_color, x, y, loadingMessage, DTA_CleanNoMove, true, TAG_DONE);
		screen->Update();

		m_time  = now;
		m_color = (CR_YELLOW == m_color) ? CR_GOLD : CR_YELLOW;
	}